

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O3

bool __thiscall
absl::numbers_internal::safe_strto32_base
          (numbers_internal *this,string_view text,int32_t *value,int base)

{
  bool bVar1;
  int iVar2;
  numbers_internal *pnVar3;
  uint uVar4;
  bool local_1d;
  int local_1c;
  string_view local_18;
  
  local_18.length_ = (size_type)text.ptr_;
  local_1c = (int)value;
  *(int *)text.length_ = 0;
  local_18.ptr_ = (char *)this;
  bVar1 = anon_unknown_0::safe_parse_sign_and_base(&local_18,&local_1c,&local_1d);
  if (!bVar1) {
    return false;
  }
  if (local_1d == false) {
    if ((long)local_1c < 0) {
      __assert_fail("base >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/strings/numbers.cc"
                    ,0x319,
                    "bool absl::(anonymous namespace)::safe_parse_positive_int(absl::string_view, int, IntType *) [IntType = int]"
                   );
    }
    bVar1 = true;
    if (0 < (long)local_18.length_) {
      pnVar3 = (numbers_internal *)(local_18.length_ + (long)local_18.ptr_);
      iVar2 = 0;
      do {
        uVar4 = (uint)(char)(anonymous_namespace)::kAsciiToInt[(byte)*local_18.ptr_];
        if (local_1c <= (int)uVar4) goto LAB_0022edb2;
        if ((*(int *)((anonymous_namespace)::LookupTables<int>::kVmaxOverBase + (long)local_1c * 4)
             < iVar2) || ((int)(uVar4 ^ 0x7fffffff) < iVar2 * local_1c)) {
          bVar1 = false;
          iVar2 = 0x7fffffff;
          break;
        }
        iVar2 = iVar2 * local_1c + uVar4;
        local_18.ptr_ = (char *)((numbers_internal *)local_18.ptr_ + 1);
      } while (local_18.ptr_ < pnVar3);
      goto LAB_0022edc6;
    }
  }
  else {
    bVar1 = true;
    if (0 < (long)local_18.length_) {
      pnVar3 = (numbers_internal *)(local_18.length_ + (long)local_18.ptr_);
      iVar2 = 0;
      do {
        uVar4 = (uint)(char)(anonymous_namespace)::kAsciiToInt[(byte)*local_18.ptr_];
        if (local_1c <= (int)uVar4) goto LAB_0022edb2;
        if ((iVar2 < *(int *)((anonymous_namespace)::LookupTables<int>::kVminOverBase +
                             (long)local_1c * 4)) || (iVar2 * local_1c < (int)(uVar4 | 0x80000000)))
        {
          bVar1 = false;
          iVar2 = -0x80000000;
          break;
        }
        iVar2 = iVar2 * local_1c - uVar4;
        local_18.ptr_ = (char *)((numbers_internal *)local_18.ptr_ + 1);
      } while (local_18.ptr_ < pnVar3);
      goto LAB_0022edc6;
    }
  }
  bVar1 = true;
  iVar2 = 0;
LAB_0022edc6:
  *(int *)text.length_ = iVar2;
  return bVar1;
LAB_0022edb2:
  bVar1 = false;
  goto LAB_0022edc6;
}

Assistant:

bool safe_strto32_base(absl::string_view text, int32_t* value, int base) {
  return safe_int_internal<int32_t>(text, value, base);
}